

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  bool bVar3;
  ImGuiNavLayer IVar4;
  uint uVar5;
  ImGuiContextHook *pIVar6;
  _func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *p_Var7;
  ImGuiViewport **ppIVar8;
  ImGuiWindow **ppIVar9;
  unsigned_short *puVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *ctx_00;
  ImGuiContext *pIVar12;
  ImGuiID key;
  ImVec2 in_RAX;
  ImGuiContext *g_1;
  ImGuiViewportP *pIVar13;
  ImGuiWindow *pIVar14;
  ImGuiViewport *pIVar15;
  ImGuiViewport **ppIVar16;
  ImGuiWindow **ppIVar17;
  ulong uVar18;
  unsigned_short *__dest;
  uint uVar19;
  int iVar20;
  ImGuiContext *g_3;
  char *pcVar21;
  char *label;
  char *pcVar22;
  byte bVar23;
  ImGuiContext *g;
  int iVar24;
  int iVar25;
  ImGuiContext *g_2;
  long lVar26;
  ImGuiContext *ctx;
  long lVar27;
  ulong uVar28;
  float fVar29;
  ImVec2 IVar32;
  float fVar30;
  float fVar31;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  ImVec2 local_38;
  
  ctx_00 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x13b1,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x13b6,"void ImGui::EndFrame()");
  }
  local_38 = in_RAX;
  if (0 < (GImGui->Hooks).Size) {
    lVar26 = 0;
    lVar27 = 0;
    do {
      pIVar6 = (ctx_00->Hooks).Data;
      if (*(int *)(pIVar6 + lVar26 + 4) == 2) {
        (**(code **)(pIVar6 + lVar26 + 0x10))(ctx_00,pIVar6 + lVar26);
      }
      lVar27 = lVar27 + 1;
      lVar26 = lVar26 + 0x20;
    } while (lVar27 < (ctx_00->Hooks).Size);
  }
  bVar3 = (GImGui->IO).KeyCtrl;
  uVar19 = bVar3 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar19 = (uint)bVar3;
  }
  uVar5 = uVar19 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar5 = uVar19;
  }
  uVar19 = uVar5 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar19 = uVar5;
  }
  if ((uVar19 != 0) && ((GImGui->IO).KeyMods != uVar19)) {
    __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x21e2,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar24 = (GImGui->CurrentWindowStack).Size;
  if (iVar24 != 1) {
    if (1 < iVar24) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x21ee,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x21f4,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if ((GImGui->GroupStack).Size != 0) {
    __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x21f8,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var7 = (ctx_00->IO).SetPlatformImeDataFn;
  if ((p_Var7 != (_func_void_ImGuiViewport_ptr_ImGuiPlatformImeData_ptr *)0x0) &&
     (auVar33[0] = -((ctx_00->PlatformImeDataPrev).WantVisible ==
                    (ctx_00->PlatformImeData).WantVisible),
     auVar33[1] = -((ctx_00->PlatformImeDataPrev).field_0x1 == (ctx_00->PlatformImeData).field_0x1),
     auVar33[2] = -((ctx_00->PlatformImeDataPrev).field_0x2 == (ctx_00->PlatformImeData).field_0x2),
     auVar33[3] = -((ctx_00->PlatformImeDataPrev).field_0x3 == (ctx_00->PlatformImeData).field_0x3),
     auVar33[4] = -(*(char *)&(ctx_00->PlatformImeDataPrev).InputPos.x ==
                   *(char *)&(ctx_00->PlatformImeData).InputPos.x),
     auVar33[5] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputPos.x + 1) ==
                   *(char *)((long)&(ctx_00->PlatformImeData).InputPos.x + 1)),
     auVar33[6] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputPos.x + 2) ==
                   *(char *)((long)&(ctx_00->PlatformImeData).InputPos.x + 2)),
     auVar33[7] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputPos.x + 3) ==
                   *(char *)((long)&(ctx_00->PlatformImeData).InputPos.x + 3)),
     auVar33[8] = -(*(char *)&(ctx_00->PlatformImeDataPrev).InputPos.y ==
                   *(char *)&(ctx_00->PlatformImeData).InputPos.y),
     auVar33[9] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputPos.y + 1) ==
                   *(char *)((long)&(ctx_00->PlatformImeData).InputPos.y + 1)),
     auVar33[10] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputPos.y + 2) ==
                    *(char *)((long)&(ctx_00->PlatformImeData).InputPos.y + 2)),
     auVar33[0xb] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputPos.y + 3) ==
                     *(char *)((long)&(ctx_00->PlatformImeData).InputPos.y + 3)),
     auVar33[0xc] = -(*(char *)&(ctx_00->PlatformImeDataPrev).InputLineHeight ==
                     *(char *)&(ctx_00->PlatformImeData).InputLineHeight),
     auVar33[0xd] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputLineHeight + 1) ==
                     *(char *)((long)&(ctx_00->PlatformImeData).InputLineHeight + 1)),
     auVar33[0xe] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputLineHeight + 2) ==
                     *(char *)((long)&(ctx_00->PlatformImeData).InputLineHeight + 2)),
     auVar33[0xf] = -(*(char *)((long)&(ctx_00->PlatformImeDataPrev).InputLineHeight + 3) ==
                     *(char *)((long)&(ctx_00->PlatformImeData).InputLineHeight + 3)),
     (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf)
     != 0xffff)) {
    lVar26 = (long)(GImGui->Viewports).Size;
    if (0 < lVar26) {
      lVar27 = 0;
      do {
        pIVar13 = (GImGui->Viewports).Data[lVar27];
        if ((pIVar13->super_ImGuiViewport).ID == ctx_00->PlatformImeViewport) goto LAB_0015e257;
        lVar27 = lVar27 + 1;
      } while (lVar26 != lVar27);
    }
    pIVar13 = (ImGuiViewportP *)0x0;
LAB_0015e257:
    if (pIVar13 == (ImGuiViewportP *)0x0) {
      pIVar13 = (ImGuiViewportP *)GetMainViewport();
    }
    (*p_Var7)(&pIVar13->super_ImGuiViewport,&ctx_00->PlatformImeData);
  }
  ctx_00->WithinFrameScopeWithImplicitWindow = false;
  pIVar14 = ctx_00->CurrentWindow;
  if ((pIVar14 != (ImGuiWindow *)0x0) && (pIVar14->WriteAccessed == false)) {
    pIVar14->Active = false;
  }
  End();
  pIVar12 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      key = ImHashStr("###NavWindowingList",0,0);
      pIVar14 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar12->WindowsById,key);
      pIVar12->NavWindowingListWindow = pIVar14;
    }
    pIVar15 = GetMainViewport();
    pIVar11 = GImGui;
    fVar30 = (pIVar15->Size).x;
    fVar34 = (pIVar15->Size).y;
    uVar19 = (GImGui->NextWindowData).Flags;
    (GImGui->NextWindowData).Flags = uVar19 | 0x10;
    (pIVar11->NextWindowData).SizeConstraintRect.Min.x = fVar30 * 0.2;
    (pIVar11->NextWindowData).SizeConstraintRect.Min.y = fVar34 * 0.2;
    (pIVar11->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar11->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar11->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar11->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar32.x = (pIVar15->Size).x * 0.5 + (pIVar15->Pos).x;
    IVar32.y = (pIVar15->Size).y * 0.5 + (pIVar15->Pos).y;
    (pIVar11->NextWindowData).Flags = uVar19 | 0x11;
    (pIVar11->NextWindowData).PosVal = IVar32;
    (pIVar11->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar11->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar11->NextWindowData).PosCond = 1;
    (pIVar11->NextWindowData).PosUndock = true;
    fVar30 = (pIVar12->Style).WindowPadding.x;
    fVar34 = (pIVar12->Style).WindowPadding.y;
    local_38.x = fVar30 + fVar30;
    local_38.y = fVar34 + fVar34;
    PushStyleVar(2,&local_38);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar26 = (long)(pIVar12->WindowsFocusOrder).Size;
    if (0 < lVar26) {
      do {
        if ((pIVar12->WindowsFocusOrder).Size < lVar26) goto LAB_0015ed02;
        pIVar14 = (pIVar12->WindowsFocusOrder).Data[lVar26 + -1];
        if (pIVar14 == (ImGuiWindow *)0x0) {
          __assert_fail("window != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2d67,"void ImGui::NavUpdateWindowingOverlay()");
        }
        if (((pIVar14->WasActive == true) && (pIVar14->RootWindow == pIVar14)) &&
           (uVar19 = pIVar14->Flags, (uVar19 >> 0x13 & 1) == 0)) {
          pcVar22 = pIVar14->Name;
          pcVar21 = pcVar22;
          if (pcVar22 != (char *)0xffffffffffffffff) {
            do {
              if (*pcVar21 == '#') {
                if (pcVar21[1] == '#') goto LAB_0015e48a;
              }
              else if (*pcVar21 == '\0') goto LAB_0015e48a;
              pcVar21 = pcVar21 + 1;
            } while (pcVar21 != (char *)0xffffffffffffffff);
            pcVar21 = (char *)0xffffffffffffffff;
          }
LAB_0015e48a:
          label = pcVar22;
          if ((pcVar22 == pcVar21) && (label = "(Popup)", (uVar19 >> 0x1a & 1) == 0)) {
            if ((uVar19 >> 10 & 1) != 0) {
              iVar24 = strcmp(pcVar22,"##MainMenuBar");
              label = "(Main menu bar)";
              if (iVar24 == 0) goto LAB_0015e4d8;
            }
            label = "(Dock node)";
            if (pIVar14->DockNodeAsHost == (ImGuiDockNode *)0x0) {
              label = "(Untitled)";
            }
          }
LAB_0015e4d8:
          local_38.x = 0.0;
          local_38.y = 0.0;
          Selectable(label,pIVar12->NavWindowingTarget == pIVar14,0,&local_38);
        }
        bVar3 = 1 < lVar26;
        lVar26 = lVar26 + -1;
      } while (bVar3);
    }
    End();
    PopStyleVar(1);
  }
  pIVar11 = GImGui;
  if (((pIVar12->NavWindow != (ImGuiWindow *)0x0) && (GImGui->NavMoveScoringItems == true)) &&
     (((GImGui->NavMoveResultLocal).ID == 0 &&
      (((GImGui->NavMoveResultOther).ID == 0 &&
       (-1 < (char)pIVar12->NavMoveFlags && (pIVar12->NavMoveFlags & 0xfU) != 0)))))) {
    pIVar14 = GImGui->NavWindow;
    IVar4 = GImGui->NavLayer;
    fVar30 = pIVar14->NavRectRel[IVar4].Min.x;
    fVar34 = pIVar14->NavRectRel[IVar4].Min.y;
    fVar31 = pIVar14->NavRectRel[IVar4].Max.x;
    fVar29 = pIVar14->NavRectRel[IVar4].Max.y;
    iVar24 = GImGui->NavMoveDir;
    uVar19 = GImGui->NavMoveFlags;
    iVar25 = 0;
    if (iVar24 == 0) {
      if ((uVar19 & 5) == 0) {
        bVar3 = false;
        iVar25 = 0;
      }
      else {
        fVar30 = (pIVar14->ContentSize).x + (pIVar14->WindowPadding).x;
        bVar3 = true;
        fVar31 = fVar30;
        if ((uVar19 & 4) != 0) {
          fVar35 = fVar29 - fVar34;
          fVar34 = fVar34 - fVar35;
          fVar29 = fVar29 - fVar35;
          iVar25 = 2;
        }
      }
    }
    else {
      bVar3 = false;
      iVar25 = iVar24;
    }
    if ((uVar19 & 5) != 0 && iVar24 == 1) {
      fVar30 = -(pIVar14->WindowPadding).x;
      bVar3 = true;
      fVar31 = fVar30;
      if ((uVar19 & 4) != 0) {
        fVar35 = fVar29 - fVar34;
        fVar34 = fVar34 + fVar35;
        fVar29 = fVar29 + fVar35;
        iVar25 = 3;
      }
    }
    if ((uVar19 & 10) != 0 && iVar24 == 2) {
      fVar34 = (pIVar14->ContentSize).y + (pIVar14->WindowPadding).y;
      bVar3 = true;
      fVar29 = fVar34;
      if ((uVar19 & 8) != 0) {
        fVar35 = fVar31 - fVar30;
        fVar30 = fVar30 - fVar35;
        fVar31 = fVar31 - fVar35;
        iVar25 = 0;
      }
    }
    if (iVar24 == 3 && (uVar19 & 10) != 0) {
      fVar34 = -(pIVar14->WindowPadding).y;
      bVar3 = true;
      fVar29 = fVar34;
      if ((uVar19 & 8) != 0) {
        fVar35 = fVar31 - fVar30;
        fVar30 = fVar30 + fVar35;
        fVar31 = fVar31 + fVar35;
        iVar25 = 1;
      }
    }
    if (bVar3) {
      pIVar14->NavRectRel[IVar4].Min.x = fVar30;
      pIVar14->NavRectRel[IVar4].Min.y = fVar34;
      pIVar14->NavRectRel[IVar4].Max.x = fVar31;
      pIVar14->NavRectRel[IVar4].Max.y = fVar29;
      NavMoveRequestForward(iVar24,iVar25,uVar19,pIVar11->NavMoveScrollFlags);
    }
  }
  DockContextEndFrame(ctx_00);
  pIVar12 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar12->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  if (ctx_00->DragDropActive == true) {
    if ((ctx_00->DragDropPayload).DataFrameCount + 1 < ctx_00->FrameCount) {
      bVar23 = 1;
      if ((ctx_00->DragDropSourceFlags & 0x20) == 0) {
        if (4 < (ulong)(uint)ctx_00->DragDropMouseButton) {
          __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x2043,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
        }
        bVar23 = (pIVar12->IO).MouseDown[(uint)ctx_00->DragDropMouseButton] ^ 1;
      }
    }
    else {
      bVar23 = 0;
    }
    if ((bVar23 != 0) || ((ctx_00->DragDropPayload).Delivery != false)) {
      ClearDragDrop();
    }
  }
  if (((ctx_00->DragDropActive == true) && (ctx_00->DragDropSourceFrameCount < ctx_00->FrameCount))
     && ((ctx_00->DragDropSourceFlags & 1) == 0)) {
    ctx_00->DragDropWithinSource = true;
    SetTooltip("...");
    ctx_00->DragDropWithinSource = false;
  }
  ctx_00->WithinFrameScope = false;
  ctx_00->FrameCountEnded = ctx_00->FrameCount;
  UpdateMouseMovingWindowEndFrame();
  pIVar12 = GImGui;
  iVar24 = (GImGui->PlatformIO).Viewports.Capacity;
  if (iVar24 < 0) {
    uVar19 = iVar24 / 2 + iVar24;
    uVar18 = 0;
    if (0 < (int)uVar19) {
      uVar18 = (ulong)uVar19;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar16 = (ImGuiViewport **)(*GImAllocatorAllocFunc)(uVar18 * 8,GImAllocatorUserData);
    ppIVar8 = (pIVar12->PlatformIO).Viewports.Data;
    if (ppIVar8 != (ImGuiViewport **)0x0) {
      memcpy(ppIVar16,ppIVar8,(long)(pIVar12->PlatformIO).Viewports.Size << 3);
      ppIVar8 = (pIVar12->PlatformIO).Viewports.Data;
      if ((ppIVar8 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
    }
    (pIVar12->PlatformIO).Viewports.Data = ppIVar16;
    (pIVar12->PlatformIO).Viewports.Capacity = (int)uVar18;
  }
  (pIVar12->PlatformIO).Viewports.Size = 0;
  if (0 < (pIVar12->Viewports).Size) {
    lVar26 = 0;
    do {
      pIVar13 = (pIVar12->Viewports).Data[lVar26];
      pIVar13->LastPos = (pIVar13->super_ImGuiViewport).Pos;
      if ((pIVar13->LastFrameActive < pIVar12->FrameCount) ||
         ((pIVar13->super_ImGuiViewport).Size.x <= 0.0)) {
        if (lVar26 == 0) goto LAB_0015e8b3;
      }
      else if ((lVar26 == 0) || (0.0 < (pIVar13->super_ImGuiViewport).Size.y)) {
LAB_0015e8b3:
        pIVar14 = pIVar13->Window;
        if ((pIVar14 == (ImGuiWindow *)0x0) ||
           ((pIVar14->Active == true && (pIVar14->Hidden == false)))) {
          if ((lVar26 != 0) && (pIVar14 == (ImGuiWindow *)0x0)) {
            __assert_fail("viewport->Window != __null",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                          ,0x327f,"void ImGui::UpdateViewportsEndFrame()");
          }
          iVar24 = (pIVar12->PlatformIO).Viewports.Size;
          iVar25 = (pIVar12->PlatformIO).Viewports.Capacity;
          if (iVar24 == iVar25) {
            if (iVar25 == 0) {
              iVar20 = 8;
            }
            else {
              iVar20 = iVar25 / 2 + iVar25;
            }
            iVar24 = iVar24 + 1;
            if (iVar24 < iVar20) {
              iVar24 = iVar20;
            }
            if (iVar25 < iVar24) {
              if (GImGui != (ImGuiContext *)0x0) {
                piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar1 = *piVar1 + 1;
              }
              ppIVar16 = (ImGuiViewport **)
                         (*GImAllocatorAllocFunc)((long)iVar24 << 3,GImAllocatorUserData);
              ppIVar8 = (pIVar12->PlatformIO).Viewports.Data;
              if (ppIVar8 != (ImGuiViewport **)0x0) {
                memcpy(ppIVar16,ppIVar8,(long)(pIVar12->PlatformIO).Viewports.Size << 3);
                ppIVar8 = (pIVar12->PlatformIO).Viewports.Data;
                if ((ppIVar8 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar1 = *piVar1 + -1;
                }
                (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
              }
              (pIVar12->PlatformIO).Viewports.Data = ppIVar16;
              (pIVar12->PlatformIO).Viewports.Capacity = iVar24;
            }
          }
          (pIVar12->PlatformIO).Viewports.Data[(pIVar12->PlatformIO).Viewports.Size] =
               &pIVar13->super_ImGuiViewport;
          pIVar2 = &(pIVar12->PlatformIO).Viewports;
          pIVar2->Size = pIVar2->Size + 1;
        }
      }
      lVar26 = lVar26 + 1;
      iVar24 = (pIVar12->Viewports).Size;
    } while (lVar26 < iVar24);
    if (0 < iVar24) {
      pIVar13 = *(pIVar12->Viewports).Data;
      (pIVar13->super_ImGuiViewport).PlatformRequestMove = false;
      (pIVar13->super_ImGuiViewport).PlatformRequestResize = false;
      (pIVar13->super_ImGuiViewport).PlatformRequestClose = false;
      iVar24 = (ctx_00->WindowsTempSortBuffer).Capacity;
      if (iVar24 < 0) {
        uVar19 = iVar24 / 2 + iVar24;
        uVar18 = 0;
        if (0 < (int)uVar19) {
          uVar18 = (ulong)uVar19;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        ppIVar17 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar18 * 8,GImAllocatorUserData);
        ppIVar9 = (ctx_00->WindowsTempSortBuffer).Data;
        if (ppIVar9 != (ImGuiWindow **)0x0) {
          memcpy(ppIVar17,ppIVar9,(long)(ctx_00->WindowsTempSortBuffer).Size << 3);
          ppIVar9 = (ctx_00->WindowsTempSortBuffer).Data;
          if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
        }
        (ctx_00->WindowsTempSortBuffer).Data = ppIVar17;
        (ctx_00->WindowsTempSortBuffer).Capacity = (int)uVar18;
      }
      (ctx_00->WindowsTempSortBuffer).Size = 0;
      iVar24 = (ctx_00->Windows).Size;
      if ((ctx_00->WindowsTempSortBuffer).Capacity < iVar24) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        ppIVar17 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar24 << 3,GImAllocatorUserData);
        ppIVar9 = (ctx_00->WindowsTempSortBuffer).Data;
        if (ppIVar9 != (ImGuiWindow **)0x0) {
          memcpy(ppIVar17,ppIVar9,(long)(ctx_00->WindowsTempSortBuffer).Size << 3);
          ppIVar9 = (ctx_00->WindowsTempSortBuffer).Data;
          if ((ppIVar9 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar9,GImAllocatorUserData);
        }
        (ctx_00->WindowsTempSortBuffer).Data = ppIVar17;
        (ctx_00->WindowsTempSortBuffer).Capacity = iVar24;
      }
      uVar19 = (ctx_00->Windows).Size;
      uVar18 = (ulong)uVar19;
      if (uVar19 != 0) {
        uVar28 = 0;
        do {
          if ((long)(int)uVar18 <= (long)uVar28) goto LAB_0015ed02;
          pIVar14 = (ctx_00->Windows).Data[uVar28];
          if ((pIVar14->Active != true) || ((pIVar14->Flags & 0x1000000) == 0)) {
            AddWindowToSortBuffer(&ctx_00->WindowsTempSortBuffer,pIVar14);
          }
          uVar28 = uVar28 + 1;
          uVar19 = (ctx_00->Windows).Size;
          uVar18 = (ulong)uVar19;
        } while (uVar28 != uVar18);
      }
      uVar5 = (ctx_00->WindowsTempSortBuffer).Size;
      if (uVar19 != uVar5) {
        __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x13f9,"void ImGui::EndFrame()");
      }
      (ctx_00->WindowsTempSortBuffer).Size = uVar19;
      (ctx_00->Windows).Size = uVar5;
      iVar24 = (ctx_00->WindowsTempSortBuffer).Capacity;
      (ctx_00->WindowsTempSortBuffer).Capacity = (ctx_00->Windows).Capacity;
      (ctx_00->Windows).Capacity = iVar24;
      ppIVar9 = (ctx_00->WindowsTempSortBuffer).Data;
      (ctx_00->WindowsTempSortBuffer).Data = (ctx_00->Windows).Data;
      (ctx_00->Windows).Data = ppIVar9;
      (ctx_00->IO).MetricsActiveWindows = ctx_00->WindowsActiveCount;
      ((ctx_00->IO).Fonts)->Locked = false;
      (ctx_00->IO).MouseWheel = 0.0;
      (ctx_00->IO).MouseWheelH = 0.0;
      iVar24 = (ctx_00->IO).InputQueueCharacters.Capacity;
      if (iVar24 < 0) {
        iVar24 = iVar24 / 2 + iVar24;
        iVar25 = 0;
        if (0 < iVar24) {
          iVar25 = iVar24;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (unsigned_short *)
                 (*GImAllocatorAllocFunc)((ulong)(uint)(iVar25 * 2),GImAllocatorUserData);
        puVar10 = (ctx_00->IO).InputQueueCharacters.Data;
        if (puVar10 != (unsigned_short *)0x0) {
          memcpy(__dest,puVar10,(long)(ctx_00->IO).InputQueueCharacters.Size * 2);
          puVar10 = (ctx_00->IO).InputQueueCharacters.Data;
          if ((puVar10 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(puVar10,GImAllocatorUserData);
        }
        (ctx_00->IO).InputQueueCharacters.Data = __dest;
        (ctx_00->IO).InputQueueCharacters.Capacity = iVar25;
      }
      (ctx_00->IO).InputQueueCharacters.Size = 0;
      (ctx_00->IO).NavInputs[0] = 0.0;
      (ctx_00->IO).NavInputs[1] = 0.0;
      (ctx_00->IO).NavInputs[2] = 0.0;
      (ctx_00->IO).NavInputs[3] = 0.0;
      (ctx_00->IO).NavInputs[4] = 0.0;
      (ctx_00->IO).NavInputs[5] = 0.0;
      (ctx_00->IO).NavInputs[6] = 0.0;
      (ctx_00->IO).NavInputs[7] = 0.0;
      (ctx_00->IO).NavInputs[8] = 0.0;
      (ctx_00->IO).NavInputs[9] = 0.0;
      (ctx_00->IO).NavInputs[10] = 0.0;
      (ctx_00->IO).NavInputs[0xb] = 0.0;
      (ctx_00->IO).NavInputs[0xc] = 0.0;
      (ctx_00->IO).NavInputs[0xd] = 0.0;
      (ctx_00->IO).NavInputs[0xe] = 0.0;
      (ctx_00->IO).NavInputs[0xf] = 0.0;
      (ctx_00->IO).NavInputs[0x10] = 0.0;
      (ctx_00->IO).NavInputs[0x11] = 0.0;
      (ctx_00->IO).NavInputs[0x12] = 0.0;
      (ctx_00->IO).NavInputs[0x13] = 0.0;
      if ((ctx_00->Hooks).Size < 1) {
        return;
      }
      lVar26 = 0;
      lVar27 = 0;
      do {
        pIVar6 = (ctx_00->Hooks).Data;
        if (*(int *)(pIVar6 + lVar26 + 4) == 3) {
          (**(code **)(pIVar6 + lVar26 + 0x10))(ctx_00,pIVar6 + lVar26);
        }
        lVar27 = lVar27 + 1;
        lVar26 = lVar26 + 0x20;
      } while (lVar27 < (ctx_00->Hooks).Size);
      return;
    }
  }
  pcVar22 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_0015ed17:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x74f,pcVar22);
LAB_0015ed02:
  pcVar22 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
  goto LAB_0015ed17;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify Platform/OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.SetPlatformImeDataFn && memcmp(&g.PlatformImeData, &g.PlatformImeDataPrev, sizeof(ImGuiPlatformImeData)) != 0)
    {
        ImGuiViewport* viewport = FindViewportByID(g.PlatformImeViewport);
        g.IO.SetPlatformImeDataFn(viewport ? viewport : GetMainViewport(), &g.PlatformImeData);
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Update docking
    DockContextEndFrame(&g);

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}